

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

Error __thiscall llvm::sys::fs::TempFile::discard(TempFile *this)

{
  StringRef Filename;
  int iVar1;
  int iVar2;
  int *piVar3;
  size_t unaff_RBX;
  undefined1 *in_RSI;
  error_code EC;
  char *in_stack_ffffffffffffffd0;
  
  *in_RSI = 1;
  std::_V2::system_category();
  if (*(long *)(in_RSI + 0x10) != 0) {
    Twine::Twine((Twine *)&stack0xffffffffffffffc0,(string *)(in_RSI + 8));
    iVar1 = remove((fs *)&stack0xffffffffffffffc0,(char *)0x1);
    Filename.Length = unaff_RBX;
    Filename.Data = in_stack_ffffffffffffffd0;
    DontRemoveFileOnSignal(Filename);
    if (iVar1 != 0) goto LAB_00179dc8;
  }
  std::__cxx11::string::assign((char *)(in_RSI + 8));
  iVar1 = 0;
LAB_00179dc8:
  if ((*(int *)(in_RSI + 0x28) == -1) || (iVar2 = close(*(int *)(in_RSI + 0x28)), iVar2 != -1)) {
    *(undefined4 *)(in_RSI + 0x28) = 0xffffffff;
  }
  else {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    std::_V2::generic_category();
  }
  EC._M_cat._0_4_ = iVar1;
  EC._0_8_ = this;
  EC._M_cat._4_4_ = 0;
  errorCodeToError(EC);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error TempFile::discard() {
  Done = true;
  std::error_code RemoveEC;
// On windows closing will remove the file.
#ifndef _WIN32
  // Always try to close and remove.
  if (!TmpName.empty()) {
    RemoveEC = fs::remove(TmpName);
    sys::DontRemoveFileOnSignal(TmpName);
  }
#endif

  if (!RemoveEC)
    TmpName = "";

  if (FD != -1 && close(FD) == -1) {
    std::error_code EC = std::error_code(errno, std::generic_category());
    return errorCodeToError(EC);
  }
  FD = -1;

  return errorCodeToError(RemoveEC);
}